

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cpp::QualifiedFileLevelSymbol
                   (string *__return_storage_ptr__,string *package,string *name)

{
  ulong uVar1;
  AlphaNum *in_RCX;
  AlphaNum *in_R9;
  AlphaNum local_170;
  AlphaNum local_140;
  string local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  AlphaNum local_50;
  string *local_20;
  string *name_local;
  string *package_local;
  
  local_20 = name;
  name_local = package;
  package_local = __return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    strings::AlphaNum::AlphaNum(&local_b0,"::");
    anon_unknown_0::DotsToColons(&local_100,name_local);
    strings::AlphaNum::AlphaNum(&local_e0,&local_100);
    strings::AlphaNum::AlphaNum(&local_140,"::");
    strings::AlphaNum::AlphaNum(&local_170,local_20);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_b0,&local_e0,&local_140,&local_170,
                      in_R9);
    std::__cxx11::string::~string((string *)&local_100);
  }
  else {
    strings::AlphaNum::AlphaNum(&local_50,"::");
    strings::AlphaNum::AlphaNum(&local_80,local_20);
    StrCat_abi_cxx11_(__return_storage_ptr__,(protobuf *)&local_50,&local_80,in_RCX);
  }
  return __return_storage_ptr__;
}

Assistant:

string QualifiedFileLevelSymbol(const string& package, const string& name) {
  if (package.empty()) {
    return StrCat("::", name);
  }
  return StrCat("::", DotsToColons(package), "::", name);
}